

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass2_strategy.c
# Opt level: O0

int av1_calc_arf_boost(TWO_PASS *twopass,TWO_PASS_FRAME *twopass_frame,PRIMARY_RATE_CONTROL *p_rc,
                      FRAME_INFO *frame_info,int offset,int f_frames,int b_frames,
                      int *num_fpstats_used,int *num_fpstats_required,int project_gfu_boost)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  FIRSTPASS_STATS *pFVar4;
  int *in_RCX;
  TWO_PASS_FRAME *in_RSI;
  TWO_PASS *in_RDI;
  int in_R8D;
  int in_R9D;
  double dVar5;
  int in_stack_00000008;
  int *in_stack_00000010;
  int *in_stack_00000018;
  int in_stack_00000020;
  FIRSTPASS_STATS *this_frame_1;
  FIRSTPASS_STATS *this_frame;
  int flash_detected;
  int arf_boost;
  double boost_score;
  GF_GROUP_STATS gf_stats;
  int i;
  TWO_PASS_FRAME *in_stack_fffffffffffffef0;
  int offset_00;
  TWO_PASS_FRAME *in_stack_fffffffffffffef8;
  undefined7 in_stack_ffffffffffffff00;
  undefined1 in_stack_ffffffffffffff07;
  TWO_PASS_FRAME *in_stack_ffffffffffffff08;
  TWO_PASS_FRAME *in_stack_ffffffffffffff10;
  undefined7 in_stack_ffffffffffffff18;
  undefined1 in_stack_ffffffffffffff1f;
  undefined4 in_stack_ffffffffffffff34;
  double dVar6;
  FIRSTPASS_STATS *in_stack_ffffffffffffff40;
  FRAME_INFO *in_stack_ffffffffffffff48;
  PRIMARY_RATE_CONTROL *in_stack_ffffffffffffff50;
  TWO_PASS_FRAME *local_98;
  int local_2c;
  
  init_gf_stats((GF_GROUP_STATS *)&stack0xffffffffffffff40);
  dVar6 = 100.0;
  if (in_stack_00000010 != (int *)0x0) {
    *in_stack_00000010 = 0;
  }
  local_2c = 0;
  while ((local_2c < in_R9D &&
         (pFVar4 = read_frame_stats(in_RDI,in_RSI,local_2c + in_R8D),
         pFVar4 != (FIRSTPASS_STATS *)0x0))) {
    accumulate_frame_motion_stats
              (pFVar4,(GF_GROUP_STATS *)&stack0xffffffffffffff40,(double)*in_RCX,(double)in_RCX[1]);
    iVar2 = (int)((ulong)in_stack_fffffffffffffef0 >> 0x20);
    iVar1 = detect_flash((TWO_PASS *)CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00),
                         in_stack_fffffffffffffef8,iVar2);
    in_stack_ffffffffffffff1f = true;
    if (iVar1 == 0) {
      iVar1 = detect_flash((TWO_PASS *)CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00)
                           ,in_stack_fffffffffffffef8,iVar2);
      in_stack_ffffffffffffff1f = iVar1 != 0;
    }
    uVar3 = (uint)(byte)in_stack_ffffffffffffff1f;
    if (uVar3 == 0) {
      dVar5 = get_prediction_decay_rate
                        ((FIRSTPASS_STATS *)
                         CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00));
      in_stack_ffffffffffffff10 = (TWO_PASS_FRAME *)(dVar5 * (double)local_98);
      local_98 = in_stack_ffffffffffffff10;
      if ((double)in_stack_ffffffffffffff10 < 0.01) {
        in_stack_ffffffffffffff10 = (TWO_PASS_FRAME *)0x3f847ae147ae147b;
        local_98 = in_stack_ffffffffffffff10;
      }
    }
    in_stack_ffffffffffffff08 = local_98;
    dVar5 = calc_frame_boost(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
                             in_stack_ffffffffffffff40,dVar6,
                             (double)CONCAT44(in_stack_ffffffffffffff34,uVar3));
    dVar6 = (double)in_stack_ffffffffffffff08 * dVar5 + dVar6;
    if (in_stack_00000010 != (int *)0x0) {
      *in_stack_00000010 = *in_stack_00000010 + 1;
    }
    local_2c = local_2c + 1;
  }
  iVar1 = (int)dVar6;
  dVar6 = 0.0;
  init_gf_stats((GF_GROUP_STATS *)&stack0xffffffffffffff40);
  for (local_2c = -1; iVar2 = (int)((ulong)in_stack_ffffffffffffff08 >> 0x20),
      SBORROW4(local_2c,-in_stack_00000008) == local_2c + in_stack_00000008 < 0;
      local_2c = local_2c + -1) {
    pFVar4 = read_frame_stats(in_RDI,in_RSI,local_2c + in_R8D);
    iVar2 = (int)((ulong)in_stack_ffffffffffffff08 >> 0x20);
    if (pFVar4 == (FIRSTPASS_STATS *)0x0) break;
    accumulate_frame_motion_stats
              (pFVar4,(GF_GROUP_STATS *)&stack0xffffffffffffff40,(double)*in_RCX,(double)in_RCX[1]);
    offset_00 = (int)((ulong)in_stack_fffffffffffffef0 >> 0x20);
    iVar2 = detect_flash((TWO_PASS *)CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00),
                         in_stack_fffffffffffffef8,offset_00);
    in_stack_ffffffffffffff07 = true;
    if (iVar2 == 0) {
      iVar2 = detect_flash((TWO_PASS *)CONCAT17(1,in_stack_ffffffffffffff00),
                           in_stack_fffffffffffffef8,offset_00);
      in_stack_ffffffffffffff07 = iVar2 != 0;
    }
    uVar3 = (uint)(byte)in_stack_ffffffffffffff07;
    if (uVar3 == 0) {
      dVar5 = get_prediction_decay_rate
                        ((FIRSTPASS_STATS *)
                         CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00));
      in_stack_fffffffffffffef8 = (TWO_PASS_FRAME *)(dVar5 * (double)local_98);
      local_98 = in_stack_fffffffffffffef8;
      if ((double)in_stack_fffffffffffffef8 < 0.01) {
        in_stack_fffffffffffffef8 = (TWO_PASS_FRAME *)0x3f847ae147ae147b;
        local_98 = in_stack_fffffffffffffef8;
      }
    }
    dVar5 = calc_frame_boost(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
                             in_stack_ffffffffffffff40,dVar6,(double)CONCAT44(iVar1,uVar3));
    dVar6 = (double)local_98 * dVar5 + dVar6;
    if (in_stack_00000010 != (int *)0x0) {
      *in_stack_00000010 = *in_stack_00000010 + 1;
    }
    in_stack_fffffffffffffef0 = local_98;
  }
  iVar1 = (int)dVar6 + iVar1;
  if (in_stack_00000020 != 0) {
    *in_stack_00000018 = in_R9D + in_stack_00000008;
    iVar1 = get_projected_gfu_boost
                      ((PRIMARY_RATE_CONTROL *)
                       CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18),
                       (int)((ulong)in_stack_ffffffffffffff10 >> 0x20),
                       (int)in_stack_ffffffffffffff10,iVar2);
  }
  if (SBORROW4(iVar1,(in_stack_00000008 + in_R9D) * 0x32) !=
      iVar1 + (in_stack_00000008 + in_R9D) * -0x32 < 0) {
    iVar1 = (in_stack_00000008 + in_R9D) * 0x32;
  }
  return iVar1;
}

Assistant:

int av1_calc_arf_boost(const TWO_PASS *twopass,
                       const TWO_PASS_FRAME *twopass_frame,
                       const PRIMARY_RATE_CONTROL *p_rc, FRAME_INFO *frame_info,
                       int offset, int f_frames, int b_frames,
                       int *num_fpstats_used, int *num_fpstats_required,
                       int project_gfu_boost) {
  int i;
  GF_GROUP_STATS gf_stats;
  init_gf_stats(&gf_stats);
  double boost_score = (double)NORMAL_BOOST;
  int arf_boost;
  int flash_detected = 0;
  if (num_fpstats_used) *num_fpstats_used = 0;

  // Search forward from the proposed arf/next gf position.
  for (i = 0; i < f_frames; ++i) {
    const FIRSTPASS_STATS *this_frame =
        read_frame_stats(twopass, twopass_frame, i + offset);
    if (this_frame == NULL) break;

    // Update the motion related elements to the boost calculation.
    accumulate_frame_motion_stats(this_frame, &gf_stats,
                                  frame_info->frame_width,
                                  frame_info->frame_height);

    // We want to discount the flash frame itself and the recovery
    // frame that follows as both will have poor scores.
    flash_detected = detect_flash(twopass, twopass_frame, i + offset) ||
                     detect_flash(twopass, twopass_frame, i + offset + 1);

    // Accumulate the effect of prediction quality decay.
    if (!flash_detected) {
      gf_stats.decay_accumulator *= get_prediction_decay_rate(this_frame);
      gf_stats.decay_accumulator = gf_stats.decay_accumulator < MIN_DECAY_FACTOR
                                       ? MIN_DECAY_FACTOR
                                       : gf_stats.decay_accumulator;
    }

    boost_score +=
        gf_stats.decay_accumulator *
        calc_frame_boost(p_rc, frame_info, this_frame,
                         gf_stats.this_frame_mv_in_out, GF_MAX_BOOST);
    if (num_fpstats_used) (*num_fpstats_used)++;
  }

  arf_boost = (int)boost_score;

  // Reset for backward looking loop.
  boost_score = 0.0;
  init_gf_stats(&gf_stats);
  // Search backward towards last gf position.
  for (i = -1; i >= -b_frames; --i) {
    const FIRSTPASS_STATS *this_frame =
        read_frame_stats(twopass, twopass_frame, i + offset);
    if (this_frame == NULL) break;

    // Update the motion related elements to the boost calculation.
    accumulate_frame_motion_stats(this_frame, &gf_stats,
                                  frame_info->frame_width,
                                  frame_info->frame_height);

    // We want to discount the the flash frame itself and the recovery
    // frame that follows as both will have poor scores.
    flash_detected = detect_flash(twopass, twopass_frame, i + offset) ||
                     detect_flash(twopass, twopass_frame, i + offset + 1);

    // Cumulative effect of prediction quality decay.
    if (!flash_detected) {
      gf_stats.decay_accumulator *= get_prediction_decay_rate(this_frame);
      gf_stats.decay_accumulator = gf_stats.decay_accumulator < MIN_DECAY_FACTOR
                                       ? MIN_DECAY_FACTOR
                                       : gf_stats.decay_accumulator;
    }

    boost_score +=
        gf_stats.decay_accumulator *
        calc_frame_boost(p_rc, frame_info, this_frame,
                         gf_stats.this_frame_mv_in_out, GF_MAX_BOOST);
    if (num_fpstats_used) (*num_fpstats_used)++;
  }
  arf_boost += (int)boost_score;

  if (project_gfu_boost) {
    assert(num_fpstats_required != NULL);
    assert(num_fpstats_used != NULL);
    *num_fpstats_required = f_frames + b_frames;
    arf_boost = get_projected_gfu_boost(p_rc, arf_boost, *num_fpstats_required,
                                        *num_fpstats_used);
  }

  if (arf_boost < ((b_frames + f_frames) * GF_MIN_BOOST))
    arf_boost = ((b_frames + f_frames) * GF_MIN_BOOST);

  return arf_boost;
}